

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initBasicIndex(HModel *this)

{
  reference pvVar1;
  long in_RDI;
  int var;
  int numBasic;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x614); local_10 = local_10 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_10);
    if (*pvVar1 == 0) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_c);
      *pvVar1 = local_10;
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

void HModel::initBasicIndex() {
  int numBasic = 0;
  for (int var = 0; var < numTot; var++) {
    if (!nonbasicFlag[var]) {
      assert(numBasic<numRow);
      basicIndex[numBasic] = var;
      numBasic++;
    }
  }
  assert(numBasic=numRow-1);
}